

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.hpp
# Opt level: O2

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::~Field(Field<OpenMD::Vector3<double>_> *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Field() = default;